

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene.cpp
# Opt level: O3

void __thiscall aiNode::~aiNode(aiNode *this)

{
  aiNode *this_00;
  aiMetadata *this_01;
  uint a;
  ulong uVar1;
  
  if ((this->mNumChildren != 0) && (this->mChildren != (aiNode **)0x0)) {
    uVar1 = 0;
    do {
      this_00 = this->mChildren[uVar1];
      if (this_00 != (aiNode *)0x0) {
        ~aiNode(this_00);
      }
      operator_delete(this_00,0x478);
      uVar1 = uVar1 + 1;
    } while (uVar1 < this->mNumChildren);
  }
  if (this->mChildren != (aiNode **)0x0) {
    operator_delete__(this->mChildren);
  }
  if (this->mMeshes != (uint *)0x0) {
    operator_delete__(this->mMeshes);
  }
  this_01 = this->mMetaData;
  if (this_01 != (aiMetadata *)0x0) {
    aiMetadata::~aiMetadata(this_01);
  }
  operator_delete(this_01,0x18);
  return;
}

Assistant:

aiNode::~aiNode() {
    // delete all children recursively
    // to make sure we won't crash if the data is invalid ...
    if (mNumChildren && mChildren)
    {
        for (unsigned int a = 0; a < mNumChildren; a++)
            delete mChildren[a];
    }
    delete[] mChildren;
    delete[] mMeshes;
    delete mMetaData;
}